

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugMacro.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugMacro::dump(DWARFDebugMacro *this,raw_ostream *OS)

{
  uint uVar1;
  raw_ostream *prVar2;
  int iVar3;
  uint *puVar4;
  bool bVar5;
  StringRef Str;
  WithColor local_60;
  uint *local_50;
  pointer local_48;
  pointer local_40;
  int local_38;
  byte local_31;
  
  local_40 = (this->MacroLists).
             super__Vector_base<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = 0;
  for (local_48 = (this->MacroLists).
                  super__Vector_base<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; local_48 != local_40;
      local_48 = local_48 + 1) {
    puVar4 = (uint *)(local_48->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
                     super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
                     super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                     super_SmallVectorBase.BeginX;
    local_50 = puVar4 + (ulong)(local_48->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
                               super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
                               super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                               super_SmallVectorBase.Size * 6;
    for (; puVar4 != local_50; puVar4 = puVar4 + 6) {
      if (iVar3 == 0) {
        iVar3 = 0;
        local_38 = iVar3;
      }
      else {
        iVar3 = iVar3 - (uint)(*puVar4 == 4);
        local_38 = iVar3;
      }
      while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
        raw_ostream::operator<<(OS,"  ");
      }
      local_31 = *puVar4 == 3;
      WithColor::WithColor(&local_60,OS,Macro,false);
      prVar2 = local_60.OS;
      Str = dwarf::MacinfoString(*puVar4);
      raw_ostream::operator<<(prVar2,Str);
      WithColor::~WithColor(&local_60);
      uVar1 = *puVar4;
      if (uVar1 - 1 < 2) {
        prVar2 = raw_ostream::operator<<(OS," - lineno: ");
        raw_ostream::operator<<(prVar2,*(unsigned_long *)(puVar4 + 2));
        prVar2 = raw_ostream::operator<<(OS," macro: ");
        raw_ostream::operator<<(prVar2,*(char **)(puVar4 + 4));
      }
      else if (uVar1 == 3) {
        prVar2 = raw_ostream::operator<<(OS," - lineno: ");
        raw_ostream::operator<<(prVar2,*(unsigned_long *)(puVar4 + 2));
        prVar2 = raw_ostream::operator<<(OS," filenum: ");
        raw_ostream::operator<<(prVar2,*(unsigned_long *)(puVar4 + 4));
      }
      else if (uVar1 == 0xff) {
        prVar2 = raw_ostream::operator<<(OS," - constant: ");
        raw_ostream::operator<<(prVar2,*(unsigned_long *)(puVar4 + 2));
        prVar2 = raw_ostream::operator<<(OS," string: ");
        raw_ostream::operator<<(prVar2,*(char **)(puVar4 + 4));
      }
      iVar3 = local_38 + (uint)local_31;
      raw_ostream::operator<<(OS,"\n");
    }
    raw_ostream::operator<<(OS,"\n");
  }
  return;
}

Assistant:

void DWARFDebugMacro::dump(raw_ostream &OS) const {
  unsigned IndLevel = 0;
  for (const auto &Macros : MacroLists) {
    for (const Entry &E : Macros) {
      // There should not be DW_MACINFO_end_file when IndLevel is Zero. However,
      // this check handles the case of corrupted ".debug_macinfo" section.
      if (IndLevel > 0)
        IndLevel -= (E.Type == DW_MACINFO_end_file);
      // Print indentation.
      for (unsigned I = 0; I < IndLevel; I++)
        OS << "  ";
      IndLevel += (E.Type == DW_MACINFO_start_file);

      WithColor(OS, HighlightColor::Macro).get() << MacinfoString(E.Type);
      switch (E.Type) {
      default:
        // Got a corrupted ".debug_macinfo" section (invalid macinfo type).
        break;
      case DW_MACINFO_define:
      case DW_MACINFO_undef:
        OS << " - lineno: " << E.Line;
        OS << " macro: " << E.MacroStr;
        break;
      case DW_MACINFO_start_file:
        OS << " - lineno: " << E.Line;
        OS << " filenum: " << E.File;
        break;
      case DW_MACINFO_end_file:
        break;
      case DW_MACINFO_vendor_ext:
        OS << " - constant: " << E.ExtConstant;
        OS << " string: " << E.ExtStr;
        break;
      }
      OS << "\n";
    }
    OS << "\n";
  }
}